

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectref.cpp
# Opt level: O0

void __thiscall stackjit::ObjectRef::ObjectRef(ObjectRef *this,RawObjectRef objRef)

{
  uint uVar1;
  Type *pTVar2;
  ArrayType *this_00;
  int *piVar3;
  ClassType *this_01;
  ClassMetadata *this_02;
  size_t sVar4;
  int length;
  size_t elementSize;
  Type *elementType;
  ArrayType *arrayType;
  RawObjectRef objRef_local;
  ObjectRef *this_local;
  
  this->mPtr = objRef + -9;
  this->mType = *(Type **)this->mPtr;
  pTVar2 = type(this);
  uVar1 = (*pTVar2->_vptr_Type[3])();
  if ((uVar1 & 1) == 0) {
    this_01 = (ClassType *)type(this);
    this_02 = ClassType::metadata(this_01);
    sVar4 = ClassMetadata::size(this_02);
    this->mSize = sVar4;
  }
  else {
    this_00 = (ArrayType *)type(this);
    pTVar2 = ArrayType::elementType(this_00);
    sVar4 = TypeSystem::sizeOfType(pTVar2);
    piVar3 = (int *)dataPtr(this);
    this->mSize = (long)*piVar3 * sVar4 + 4;
  }
  return;
}

Assistant:

ObjectRef::ObjectRef(RawObjectRef objRef)
		: mPtr(objRef - stackjit::OBJECT_HEADER_SIZE), mType(*((const Type**)mPtr)) {
		if (type()->isArray()) {
			auto arrayType = static_cast<const ArrayType*>(type());
			auto elementType = arrayType->elementType();
			auto elementSize = TypeSystem::sizeOfType(elementType);
			auto length = *(int*)dataPtr();
			mSize = stackjit::ARRAY_LENGTH_SIZE + (length * elementSize);
		} else {
			mSize = static_cast<const ClassType*>(type())->metadata()->size();
		}
	}